

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32 field_number,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  long *plVar1;
  Reflection *input_00;
  CodedInputStream *pCVar2;
  Message *pMVar3;
  uint32 field_number_00;
  bool bVar4;
  int iVar5;
  Type TVar6;
  undefined4 extraout_var;
  UnknownFieldSet *unknown_fields;
  LogMessage *other;
  MessageFactory *pMVar7;
  MessageLite *value;
  Message *sub_message;
  LogMessage local_68;
  long *local_30;
  Reflection *message_reflection;
  CodedInputStream *input_local;
  Message *message_local;
  FieldDescriptor *field_local;
  uint32 field_number_local;
  
  message_reflection = (Reflection *)input;
  input_local = (CodedInputStream *)message;
  message_local = (Message *)field;
  field_local._0_4_ = field_number;
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  field_number_00 = (uint32)field_local;
  input_00 = message_reflection;
  local_30 = (long *)CONCAT44(extraout_var,iVar5);
  if (message_local == (Message *)0x0) {
    unknown_fields = (UnknownFieldSet *)(**(code **)(*local_30 + 0x18))(local_30,input_local);
    field_local._7_1_ =
         SkipMessageSetField((CodedInputStream *)input_00,field_number_00,unknown_fields);
  }
  else {
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if ((!bVar4) &&
       (TVar6 = FieldDescriptor::type((FieldDescriptor *)message_local), pMVar3 = message_local,
       pCVar2 = input_local, plVar1 = local_30, TVar6 == TYPE_MESSAGE)) {
      pMVar7 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      value = (MessageLite *)(**(code **)(*plVar1 + 0x138))(plVar1,pCVar2,pMVar3,pMVar7);
      bVar4 = WireFormatLite::ReadMessage((CodedInputStream *)message_reflection,value);
      return bVar4;
    }
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x1d3);
    other = LogMessage::operator<<(&local_68,"Extensions of MessageSets must be optional messages.")
    ;
    LogFinisher::operator=((LogFinisher *)((long)&sub_message + 3),other);
    LogMessage::~LogMessage(&local_68);
    field_local._7_1_ = false;
  }
  return field_local._7_1_;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32 field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == NULL) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    GOOGLE_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}